

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O0

int integers_equal(CBS *bytes,BIGNUM *bn)

{
  int iVar1;
  size_t sVar2;
  uint8_t *puVar3;
  bool bVar4;
  uint8_t local_78 [8];
  uint8_t buf [66];
  CBS copy;
  BIGNUM *bn_local;
  CBS *bytes_local;
  
  unique0x00012000 = bytes->data;
  while( true ) {
    sVar2 = CBS_len((CBS *)(buf + 0x40));
    bVar4 = false;
    if (sVar2 != 0) {
      puVar3 = CBS_data((CBS *)(buf + 0x40));
      bVar4 = *puVar3 == '\0';
    }
    if (!bVar4) break;
    CBS_skip((CBS *)(buf + 0x40),1);
  }
  sVar2 = CBS_len((CBS *)(buf + 0x40));
  if (sVar2 < 0x43) {
    sVar2 = CBS_len((CBS *)(buf + 0x40));
    iVar1 = BN_bn2bin_padded(local_78,sVar2,bn);
    if (iVar1 == 0) {
      ERR_clear_error();
      bytes_local._4_4_ = 0;
    }
    else {
      sVar2 = CBS_len((CBS *)(buf + 0x40));
      bytes_local._4_4_ = CBS_mem_equal((CBS *)(buf + 0x40),local_78,sVar2);
    }
  }
  else {
    bytes_local._4_4_ = 0;
  }
  return bytes_local._4_4_;
}

Assistant:

static int integers_equal(const CBS *bytes, const BIGNUM *bn) {
  // Although, in SEC 1, Field-Element-to-Octet-String has a fixed width,
  // OpenSSL mis-encodes the |a| and |b|, so we tolerate any number of leading
  // zeros. (This matters for P-521 whose |b| has a leading 0.)
  CBS copy = *bytes;
  while (CBS_len(&copy) > 0 && CBS_data(&copy)[0] == 0) {
    CBS_skip(&copy, 1);
  }

  if (CBS_len(&copy) > EC_MAX_BYTES) {
    return 0;
  }
  uint8_t buf[EC_MAX_BYTES];
  if (!BN_bn2bin_padded(buf, CBS_len(&copy), bn)) {
    ERR_clear_error();
    return 0;
  }

  return CBS_mem_equal(&copy, buf, CBS_len(&copy));
}